

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void wr_stores(void)

{
  store *store;
  _Bool _Var1;
  level_map_conflict *plVar2;
  uint8_t v;
  long lVar3;
  object *obj;
  
  wr_u16b(z_info->store_max);
  if (0 < world->num_towns) {
    lVar3 = 0;
    plVar2 = world;
    do {
      store = plVar2->towns[lVar3].stores;
      for (; store != (store *)0x0; store = store->next) {
        _Var1 = store_is_home(store);
        v = 0xff;
        if (!_Var1) {
          v = (uint8_t)store->owner->oidx;
        }
        wr_byte(v);
        wr_byte(store->stock_num);
        for (obj = store->stock; obj != (object *)0x0; obj = obj->next) {
          wr_item(obj->known);
          wr_item(obj);
        }
        plVar2 = world;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < plVar2->num_towns);
  }
  return;
}

Assistant:

void wr_stores(void)
{
	int i;

	wr_u16b(z_info->store_max);
	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *store = town->stores;
		while (store) {
			struct object *obj;

			/* Save the current owner */
			if (store_is_home(store))
				wr_byte(-1);
			else
				wr_byte(store->owner->oidx);

			/* Save the stock size */
			wr_byte(store->stock_num);

			/* Save the stock */
			for (obj = store->stock; obj; obj = obj->next) {
				wr_item(obj->known);
				wr_item(obj);
			}
			store = store->next;
		}
	}
}